

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

JSON __thiscall
QPDFJob::json_schema
          (QPDFJob *this,int json_version,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *__s;
  JSON JVar7;
  string MODIFY_ANNOTATIONS;
  JSON objectinfo;
  JSON attachments;
  JSON encrypt;
  JSON j_params;
  key_type kStack_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  JSON local_90;
  JSON local_80;
  JSON local_70;
  JSON local_60;
  JSON local_50;
  JSON local_40;
  
  JSON::makeDictionary();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_118,"version",(allocator<char> *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"JSON format serial number; increased for non-compatible changes",
             (allocator<char> *)&local_70);
  JSON::makeString(&local_d0);
  JSON::addDictionaryMember(&local_40,(string *)this,(JSON *)&kStack_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&kStack_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_118,"parameters",(allocator<char> *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "{\n  \"decodelevel\": \"decode level used to determine stream filterability\"\n}",
             (allocator<char> *)&local_90);
  JSON::parse((JSON *)&local_d0,&local_f0);
  JSON::addDictionaryMember(&local_70,(string *)this,(JSON *)&kStack_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&kStack_118);
  if (keys == (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    bVar2 = true;
    if (json_version != 1) goto LAB_00168a74;
    goto LAB_00168928;
  }
  sVar1 = (keys->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (json_version == 1) {
    if (sVar1 == 0) {
      bVar2 = true;
LAB_00168928:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_118,"objects",(allocator<char> *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "{\n  \"<n n R|trailer>\": \"json representation of object\"\n}",
                 (allocator<char> *)&local_90);
      JSON::parse((JSON *)&local_d0,&local_f0);
      JSON::addDictionaryMember(&local_50,(string *)this,(JSON *)&kStack_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&kStack_118);
      bVar3 = true;
      if (!bVar2) goto LAB_001689ad;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_118,"objects",(allocator<char> *)&local_f0);
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(keys,&kStack_118);
      std::__cxx11::string::~string((string *)&kStack_118);
      if (sVar6 != 0) {
        bVar2 = false;
        goto LAB_00168928;
      }
LAB_001689ad:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_118,"objectinfo",(allocator<char> *)&local_f0);
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(keys,&kStack_118);
      std::__cxx11::string::~string((string *)&kStack_118);
      if (sVar6 == 0) {
        bVar5 = true;
        goto LAB_00168b04;
      }
      bVar3 = false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"objectinfo",(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "{\n  \"<object-id>\": {\n    \"stream\": {\n      \"filter\": \"if stream, its filters, otherwise null\",\n      \"is\": \"whether the object is a stream\",\n      \"length\": \"if stream, its length, otherwise null\"\n    }\n  }\n}"
               ,(allocator<char> *)&local_80);
    JSON::parse((JSON *)&local_b0,&local_f0);
    JSON::addDictionaryMember((JSON *)&local_d0,(string *)this,(JSON *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
    bVar5 = true;
    bVar4 = true;
    if (!bVar3) goto LAB_00168b04;
LAB_00168b39:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"pages",(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "[\n  {\n    \"contents\": [\n      \"reference to each content stream\"\n    ],\n    \"images\": [\n      {\n        \"bitspercomponent\": \"bits per component\",\n        \"colorspace\": \"color space\",\n        \"decodeparms\": [\n          \"decode parameters for image data\"\n        ],\n        \"filter\": [\n          \"filters applied to image data\"\n        ],\n        \"filterable\": \"whether image data can be decoded using the decode level qpdf was invoked with\",\n        \"height\": \"image height\",\n        \"name\": \"name of image in XObject table\",\n        \"object\": \"reference to image stream\",\n        \"width\": \"image width\"\n      }\n    ],\n    \"label\": \"page label dictionary, or null if none\",\n    \"object\": \"reference to original page object\",\n    \"outlines\": [\n      {\n        \"dest\": \"outline destination dictionary\",\n        \"object\": \"reference to outline that targets this page\",\n        \"title\": \"outline title\"\n      }\n    ],\n    \"pageposfrom1\": \"position of page in document numbering from 1\"\n  }\n]"
               ,(allocator<char> *)&local_80);
    JSON::parse((JSON *)&local_b0,&local_f0);
    JSON::addDictionaryMember((JSON *)&local_d0,(string *)this,(JSON *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
    bVar2 = true;
    if (!bVar4) goto LAB_00168bbb;
LAB_00168bf1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"pagelabels",(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "[\n  {\n    \"index\": \"starting page position starting from zero\",\n    \"label\": \"page label dictionary\"\n  }\n]"
               ,(allocator<char> *)&local_80);
    JSON::parse((JSON *)&local_b0,&local_f0);
    JSON::addDictionaryMember((JSON *)&local_d0,(string *)this,(JSON *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
    bVar4 = true;
    if (!bVar2) goto LAB_00168c73;
LAB_00168ca9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"outlines",(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "[\n  {\n    \"dest\": \"outline destination dictionary\",\n    \"destpageposfrom1\": \"position of destination page in document numbered from 1; null if not known\",\n    \"kids\": \"array of descendent outlines\",\n    \"object\": \"reference to this outline\",\n    \"open\": \"whether the outline is displayed expanded\",\n    \"title\": \"outline title\"\n  }\n]"
               ,(allocator<char> *)&local_80);
    JSON::parse((JSON *)&local_b0,&local_f0);
    JSON::addDictionaryMember((JSON *)&local_d0,(string *)this,(JSON *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
    bVar2 = true;
    if (!bVar4) goto LAB_00168d2b;
LAB_00168d5c:
    bVar4 = bVar2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"acroform",(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "{\n  \"fields\": [\n    {\n      \"alternativename\": \"alternative name of field -- this is the one usually shown to users\",\n      \"annotation\": {\n        \"annotationflags\": \"annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h\",\n        \"appearancestate\": \"appearance state -- can be used to determine value for checkboxes and radio buttons\",\n        \"object\": \"reference to the annotation object\"\n      },\n      \"choices\": \"for choices fields, the list of choices presented to the user\",\n      \"defaultvalue\": \"default value of field\",\n      \"fieldflags\": \"form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h\",\n      \"fieldtype\": \"field type\",\n      \"fullname\": \"full name of field\",\n      \"ischeckbox\": \"whether field is a checkbox\",\n      \"ischoice\": \"whether field is a list, combo, or dropdown\",\n      \"isradiobutton\": \"whether field is a radio button -- buttons in a single group share a parent\",\n      \"istext\": \"whether field is a text field\",\n      \"mappingname\": \"mapping name of field\",\n      \"object\": \"reference to this form field\",\n      \"pageposfrom1\": \"position of containing page numbered from 1\",\n      \"parent\": \"reference to this field\'s parent\",\n      \"partialname\": \"partial name of field\",\n      \"quadding\": \"field quadding -- number indicating left, center, or right\",\n      \"value\": \"value of field\"\n    }\n  ],\n  \"hasacroform\": \"whether the document has interactive forms\",\n  \"needappearances\": \"whether the form fields\' appearance streams need to be regenerated\"\n}"
               ,(allocator<char> *)&local_80);
    JSON::parse((JSON *)&local_b0,&local_f0);
    JSON::addDictionaryMember((JSON *)&local_d0,(string *)this,(JSON *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&kStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
  }
  else {
    if (sVar1 == 0) {
      bVar2 = true;
LAB_00168a74:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_118,"qpdf",(allocator<char> *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "[{\n  \"jsonversion\": \"numeric JSON version\",\n  \"pdfversion\": \"PDF version as x.y\",\n  \"pushedinheritedpageresources\": \"whether inherited attributes were pushed to the page level\",\n  \"calledgetallpages\": \"whether getAllPages was called\",\n  \"maxobjectid\": \"highest object ID in output, ignored on input\"\n},\n{\n  \"<obj:n n R|trailer>\": \"json representation of object\"\n}]"
                 ,(allocator<char> *)&local_90);
      JSON::parse((JSON *)&local_d0,&local_f0);
      JSON::addDictionaryMember(&local_60,(string *)this,(JSON *)&kStack_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&kStack_118);
      bVar4 = true;
      bVar5 = false;
      if (bVar2) goto LAB_00168b39;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_118,"qpdf",(allocator<char> *)&local_f0);
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(keys,&kStack_118);
      std::__cxx11::string::~string((string *)&kStack_118);
      bVar5 = false;
      bVar2 = false;
      if (sVar6 != 0) goto LAB_00168a74;
    }
LAB_00168b04:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"pages",(allocator<char> *)&local_f0);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(keys,&kStack_118);
    std::__cxx11::string::~string((string *)&kStack_118);
    if (sVar6 != 0) {
      bVar4 = false;
      goto LAB_00168b39;
    }
LAB_00168bbb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"pagelabels",(allocator<char> *)&local_f0);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(keys,&kStack_118);
    std::__cxx11::string::~string((string *)&kStack_118);
    if (sVar6 != 0) {
      bVar2 = false;
      goto LAB_00168bf1;
    }
LAB_00168c73:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"outlines",(allocator<char> *)&local_f0);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(keys,&kStack_118);
    std::__cxx11::string::~string((string *)&kStack_118);
    if (sVar6 != 0) {
      bVar4 = false;
      goto LAB_00168ca9;
    }
LAB_00168d2b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_118,"acroform",(allocator<char> *)&local_f0);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(keys,&kStack_118);
    std::__cxx11::string::~string((string *)&kStack_118);
    bVar4 = false;
    bVar2 = false;
    if (sVar6 != 0) goto LAB_00168d5c;
  }
  __s = "modifyannotations";
  if (bVar5) {
    __s = "moddifyannotations";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_118,__s,(allocator<char> *)&local_f0);
  if (bVar4) {
LAB_00168e36:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"encrypt",&local_f1);
    std::operator+(&local_b0,
                   "{\n  \"capabilities\": {\n    \"accessibility\": \"allow extraction for accessibility?\",\n    \"extract\": \"allow extraction?\",\n    \""
                   ,&kStack_118);
    std::operator+(&local_d0,&local_b0,
                   "\": \"allow modifying annotations?\",\n    \"modify\": \"allow all modifications?\",\n    \"modifyassembly\": \"allow modifying document assembly?\",\n    \"modifyforms\": \"allow modifying forms?\",\n    \"modifyother\": \"allow other modifications?\",\n    \"printhigh\": \"allow high resolution printing?\",\n    \"printlow\": \"allow low resolution printing?\"\n  },\n  \"encrypted\": \"whether the document is encrypted\",\n  \"ownerpasswordmatched\": \"whether supplied password matched owner password; always false for non-encrypted files\",\n  \"recovereduserpassword\": \"If the owner password was used to recover the user password, reveal user password; otherwise null\",\n  \"parameters\": {\n    \"P\": \"P value from Encrypt dictionary\",\n    \"R\": \"R value from Encrypt dictionary\",\n    \"V\": \"V value from Encrypt dictionary\",\n    \"bits\": \"encryption key bit length\",\n    \"filemethod\": \"encryption method for attachments\",\n    \"key\": \"encryption key; will be null unless --show-encryption-key was specified\",\n    \"method\": \"overall encryption method: none, mixed, RC4, AESv2, AESv3\",\n    \"streammethod\": \"encryption method for streams\",\n    \"stringmethod\": \"encryption method for string\"\n  },\n  \"userpasswordmatched\": \"whether supplied password matched user password; always false for non-encrypted files\"\n}"
                  );
    JSON::parse(&local_80,&local_d0);
    JSON::addDictionaryMember(&local_90,(string *)this,(JSON *)&local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    if (!bVar4) goto LAB_00168ee2;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"encrypt",(allocator<char> *)&local_d0);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(keys,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (sVar6 != 0) goto LAB_00168e36;
LAB_00168ee2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"attachments",(allocator<char> *)&local_d0);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(keys,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (sVar6 == 0) goto LAB_00168fa1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"attachments",(allocator<char> *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "{\n  \"<attachment-key>\": {\n    \"filespec\": \"object containing the file spec\",\n    \"preferredcontents\": \"most preferred embedded file stream\",\n    \"preferredname\": \"most preferred file name\",\n    \"description\": \"description of attachment\",\n    \"names\": {\n      \"<name-key>\": \"file name for key\"\n    },\n    \"streams\": {\n      \"<stream-key>\": {\n        \"creationdate\": \"ISO-8601 creation date or null\",\n        \"modificationdate\": \"ISO-8601 modification date or null\",\n        \"mimetype\": \"mime type or null\",\n        \"checksum\": \"MD5 checksum or null\"\n      }\n    }\n  }\n}"
             ,&local_f1);
  JSON::parse(&local_90,&local_d0);
  JSON::addDictionaryMember((JSON *)&local_b0,(string *)this,(JSON *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
LAB_00168fa1:
  std::__cxx11::string::~string((string *)&kStack_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  JVar7.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar7.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar7.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFJob::json_schema(int json_version, std::set<std::string>* keys)
{
    // Style: use all lower-case keys with no dashes or underscores. Choose array or dictionary
    // based on indexing. For example, we use a dictionary for objects because we want to index by
    // object ID and an array for pages because we want to index by position. The pages in the pages
    // array contain references back to the original object, which can be resolved in the objects
    // dictionary. When a PDF construct that maps back to an original object is represented
    // separately, use "object" as the key that references the original object.

    // This JSON object doubles as a schema and as documentation for our JSON output. Any schema
    // mismatch is a bug in qpdf. This helps to enforce our policy of consistently providing a known
    // structure where every documented key will always be present, which makes it easier to consume
    // our JSON. This is discussed in more depth in the manual.
    JSON schema = JSON::makeDictionary();
    schema.addDictionaryMember(
        "version",
        JSON::makeString("JSON format serial number; increased for non-compatible changes"));
    JSON j_params = schema.addDictionaryMember("parameters", JSON::parse(R"({
  "decodelevel": "decode level used to determine stream filterability"
})"));

    bool all_keys = ((keys == nullptr) || keys->empty());

    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.
    if (json_version == 1) {
        if (all_keys || keys->count("objects")) {
            schema.addDictionaryMember("objects", JSON::parse(R"({
  "<n n R|trailer>": "json representation of object"
})"));
        }
        if (all_keys || keys->count("objectinfo")) {
            JSON objectinfo = schema.addDictionaryMember("objectinfo", JSON::parse(R"({
  "<object-id>": {
    "stream": {
      "filter": "if stream, its filters, otherwise null",
      "is": "whether the object is a stream",
      "length": "if stream, its length, otherwise null"
    }
  }
})"));
        }
    } else {
        if (all_keys || keys->count("qpdf")) {
            schema.addDictionaryMember("qpdf", JSON::parse(R"([{
  "jsonversion": "numeric JSON version",
  "pdfversion": "PDF version as x.y",
  "pushedinheritedpageresources": "whether inherited attributes were pushed to the page level",
  "calledgetallpages": "whether getAllPages was called",
  "maxobjectid": "highest object ID in output, ignored on input"
},
{
  "<obj:n n R|trailer>": "json representation of object"
}])"));
        }
    }
    if (all_keys || keys->count("pages")) {
        JSON page = schema.addDictionaryMember("pages", JSON::parse(R"([
  {
    "contents": [
      "reference to each content stream"
    ],
    "images": [
      {
        "bitspercomponent": "bits per component",
        "colorspace": "color space",
        "decodeparms": [
          "decode parameters for image data"
        ],
        "filter": [
          "filters applied to image data"
        ],
        "filterable": "whether image data can be decoded using the decode level qpdf was invoked with",
        "height": "image height",
        "name": "name of image in XObject table",
        "object": "reference to image stream",
        "width": "image width"
      }
    ],
    "label": "page label dictionary, or null if none",
    "object": "reference to original page object",
    "outlines": [
      {
        "dest": "outline destination dictionary",
        "object": "reference to outline that targets this page",
        "title": "outline title"
      }
    ],
    "pageposfrom1": "position of page in document numbering from 1"
  }
])"));
    }
    if (all_keys || keys->count("pagelabels")) {
        JSON labels = schema.addDictionaryMember("pagelabels", JSON::parse(R"([
  {
    "index": "starting page position starting from zero",
    "label": "page label dictionary"
  }
])"));
    }
    if (all_keys || keys->count("outlines")) {
        JSON outlines = schema.addDictionaryMember("outlines", JSON::parse(R"([
  {
    "dest": "outline destination dictionary",
    "destpageposfrom1": "position of destination page in document numbered from 1; null if not known",
    "kids": "array of descendent outlines",
    "object": "reference to this outline",
    "open": "whether the outline is displayed expanded",
    "title": "outline title"
  }
])"));
    }
    if (all_keys || keys->count("acroform")) {
        JSON acroform = schema.addDictionaryMember("acroform", JSON::parse(R"({
  "fields": [
    {
      "alternativename": "alternative name of field -- this is the one usually shown to users",
      "annotation": {
        "annotationflags": "annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h",
        "appearancestate": "appearance state -- can be used to determine value for checkboxes and radio buttons",
        "object": "reference to the annotation object"
      },
      "choices": "for choices fields, the list of choices presented to the user",
      "defaultvalue": "default value of field",
      "fieldflags": "form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h",
      "fieldtype": "field type",
      "fullname": "full name of field",
      "ischeckbox": "whether field is a checkbox",
      "ischoice": "whether field is a list, combo, or dropdown",
      "isradiobutton": "whether field is a radio button -- buttons in a single group share a parent",
      "istext": "whether field is a text field",
      "mappingname": "mapping name of field",
      "object": "reference to this form field",
      "pageposfrom1": "position of containing page numbered from 1",
      "parent": "reference to this field's parent",
      "partialname": "partial name of field",
      "quadding": "field quadding -- number indicating left, center, or right",
      "value": "value of field"
    }
  ],
  "hasacroform": "whether the document has interactive forms",
  "needappearances": "whether the form fields' appearance streams need to be regenerated"
})"));
    }
    std::string MODIFY_ANNOTATIONS =
        (json_version == 1 ? "moddifyannotations" : "modifyannotations");
    if (all_keys || keys->count("encrypt")) {
        JSON encrypt = schema.addDictionaryMember("encrypt", JSON::parse(R"({
  "capabilities": {
    "accessibility": "allow extraction for accessibility?",
    "extract": "allow extraction?",
    ")" + MODIFY_ANNOTATIONS + R"(": "allow modifying annotations?",
    "modify": "allow all modifications?",
    "modifyassembly": "allow modifying document assembly?",
    "modifyforms": "allow modifying forms?",
    "modifyother": "allow other modifications?",
    "printhigh": "allow high resolution printing?",
    "printlow": "allow low resolution printing?"
  },
  "encrypted": "whether the document is encrypted",
  "ownerpasswordmatched": "whether supplied password matched owner password; always false for non-encrypted files",
  "recovereduserpassword": "If the owner password was used to recover the user password, reveal user password; otherwise null",
  "parameters": {
    "P": "P value from Encrypt dictionary",
    "R": "R value from Encrypt dictionary",
    "V": "V value from Encrypt dictionary",
    "bits": "encryption key bit length",
    "filemethod": "encryption method for attachments",
    "key": "encryption key; will be null unless --show-encryption-key was specified",
    "method": "overall encryption method: none, mixed, RC4, AESv2, AESv3",
    "streammethod": "encryption method for streams",
    "stringmethod": "encryption method for string"
  },
  "userpasswordmatched": "whether supplied password matched user password; always false for non-encrypted files"
})"));
    }
    if (all_keys || keys->count("attachments")) {
        JSON attachments = schema.addDictionaryMember("attachments", JSON::parse(R"({
  "<attachment-key>": {
    "filespec": "object containing the file spec",
    "preferredcontents": "most preferred embedded file stream",
    "preferredname": "most preferred file name",
    "description": "description of attachment",
    "names": {
      "<name-key>": "file name for key"
    },
    "streams": {
      "<stream-key>": {
        "creationdate": "ISO-8601 creation date or null",
        "modificationdate": "ISO-8601 modification date or null",
        "mimetype": "mime type or null",
        "checksum": "MD5 checksum or null"
      }
    }
  }
})"));
    }
    return schema;
}